

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse2_128_8.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_striped_profile_sse2_128_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  __m128i alVar1;
  uint uVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  parasail_result_t *ppVar9;
  __m128i *palVar10;
  __m128i *ptr;
  __m128i *ptr_00;
  int8_t *ptr_01;
  byte bVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  long lVar15;
  __m128i *ptr_02;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  int8_t iVar21;
  int iVar22;
  int iVar23;
  ushort uVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  uint uVar29;
  char cVar30;
  int32_t segNum;
  long lVar31;
  bool bVar32;
  char cVar33;
  undefined4 uVar34;
  undefined1 uVar37;
  char cVar38;
  undefined1 uVar39;
  char cVar40;
  undefined1 uVar41;
  char cVar42;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  __m128i_8_t A;
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  __m128i_8_t e;
  __m128i_8_t h;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  ushort uVar52;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_striped_profile_sse2_128_8_cold_8();
  }
  else {
    pvVar3 = (profile->profile8).score;
    if (pvVar3 == (void *)0x0) {
      parasail_sg_flags_striped_profile_sse2_128_8_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_striped_profile_sse2_128_8_cold_6();
      }
      else {
        uVar2 = profile->s1Len;
        if ((int)uVar2 < 1) {
          parasail_sg_flags_striped_profile_sse2_128_8_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_striped_profile_sse2_128_8_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_striped_profile_sse2_128_8_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_striped_profile_sse2_128_8_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_striped_profile_sse2_128_8_cold_1();
        }
        else {
          iVar7 = uVar2 - 1;
          uVar17 = (ulong)uVar2 + 0xf >> 4;
          uVar16 = (uint)uVar17;
          iVar8 = iVar7 / (int)uVar16;
          uVar29 = -open;
          uVar19 = ppVar4->min;
          uVar14 = (uint)(byte)-(char)uVar19;
          if (uVar19 != uVar29 && SBORROW4(uVar19,uVar29) == (int)(uVar19 + open) < 0) {
            uVar14 = open;
          }
          cVar30 = '~' - (char)ppVar4->max;
          ppVar9 = parasail_result_new();
          if (ppVar9 != (parasail_result_t *)0x0) {
            ppVar9->flag = (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 |
                           (uint)(s2_beg != 0) << 0xe | (uint)(s2_end != 0) << 0xf | ppVar9->flag |
                           0x10100802;
            palVar10 = parasail_memalign___m128i(0x10,uVar17);
            ptr = parasail_memalign___m128i(0x10,uVar17);
            ptr_00 = parasail_memalign___m128i(0x10,uVar17);
            ptr_01 = parasail_memalign_int8_t(0x10,(ulong)(s2Len + 1));
            if ((ptr_01 != (int8_t *)0x0 && ptr_00 != (__m128i *)0x0) &&
                (ptr != (__m128i *)0x0 && palVar10 != (__m128i *)0x0)) {
              iVar12 = s2Len + -1;
              iVar18 = 0xf - iVar8;
              uVar41 = (undefined1)((uint)open >> 0x18);
              uVar39 = (undefined1)((uint)open >> 0x10);
              uVar37 = (undefined1)((uint)open >> 8);
              auVar35._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar41,uVar41),uVar39),CONCAT14(uVar39,open)) >>
                        0x20);
              auVar35[3] = uVar37;
              auVar35[2] = uVar37;
              auVar35[0] = (undefined1)open;
              auVar35[1] = auVar35[0];
              auVar35._8_8_ = 0;
              auVar35 = pshuflw(auVar35,auVar35,0);
              uVar34 = auVar35._0_4_;
              auVar49._4_4_ = uVar34;
              auVar49._0_4_ = uVar34;
              auVar49._8_4_ = uVar34;
              auVar49._12_4_ = uVar34;
              uVar41 = (undefined1)((uint)gap >> 0x18);
              uVar39 = (undefined1)((uint)gap >> 0x10);
              uVar37 = (undefined1)((uint)gap >> 8);
              auVar43._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar41,uVar41),uVar39),CONCAT14(uVar39,gap)) >>
                        0x20);
              auVar43[3] = uVar37;
              auVar43[2] = uVar37;
              auVar43[0] = (undefined1)gap;
              auVar43[1] = auVar43[0];
              auVar43._8_8_ = 0;
              auVar35 = pshuflw(auVar43,auVar43,0);
              uVar34 = auVar35._0_4_;
              bVar11 = (char)uVar14 + 0x81;
              uVar24 = (ushort)bVar11;
              auVar35 = pshuflw(ZEXT216(CONCAT11(bVar11,bVar11)),ZEXT216(CONCAT11(bVar11,bVar11)),0)
              ;
              auVar36._0_4_ = auVar35._0_4_;
              auVar36._4_4_ = auVar36._0_4_;
              auVar36._8_4_ = auVar36._0_4_;
              auVar36._12_4_ = auVar36._0_4_;
              auVar43 = ZEXT216(CONCAT11(cVar30,cVar30));
              auVar43 = pshuflw(auVar43,auVar43,0);
              auVar66._0_4_ = auVar43._0_4_;
              auVar66._4_4_ = auVar66._0_4_;
              auVar66._8_4_ = auVar66._0_4_;
              auVar66._12_4_ = auVar66._0_4_;
              uVar41 = (undefined1)((uint)iVar18 >> 0x18);
              uVar39 = (undefined1)((uint)iVar18 >> 0x10);
              uVar37 = (undefined1)((uint)iVar18 >> 8);
              auVar44._4_4_ =
                   (int)(CONCAT35(CONCAT21(CONCAT11(uVar41,uVar41),uVar39),CONCAT14(uVar39,iVar18))
                        >> 0x20);
              auVar44[3] = uVar37;
              auVar44[2] = uVar37;
              auVar44[0] = (undefined1)iVar18;
              auVar44[1] = auVar44[0];
              auVar44._8_8_ = 0;
              auVar44 = pshuflw(auVar44,auVar44,0);
              cVar30 = auVar44[0];
              cVar33 = auVar44[1];
              cVar38 = auVar44[2];
              cVar40 = auVar44[3];
              lVar15 = (long)(int)uVar29;
              uVar25 = 0;
              do {
                lVar31 = 0;
                lVar20 = lVar15;
                do {
                  lVar26 = lVar20;
                  if (s1_beg != 0) {
                    lVar26 = 0;
                  }
                  uVar37 = 0x80;
                  if (-0x80 < lVar26) {
                    uVar37 = (undefined1)lVar26;
                  }
                  *(undefined1 *)((long)&local_48 + lVar31) = uVar37;
                  lVar26 = lVar26 - (ulong)(uint)open;
                  if (lVar26 < -0x7f) {
                    lVar26 = -0x80;
                  }
                  *(char *)((long)&local_58 + lVar31) = (char)lVar26;
                  lVar31 = lVar31 + 1;
                  lVar20 = lVar20 - uVar17 * (uint)gap;
                } while (lVar31 != 0x10);
                palVar10[uVar25][0] = local_48;
                palVar10[uVar25][1] = lStack_40;
                ptr_00[uVar25][0] = local_58;
                ptr_00[uVar25][1] = lStack_50;
                uVar25 = uVar25 + 1;
                lVar15 = lVar15 - (ulong)(uint)gap;
              } while (uVar25 != uVar17);
              *ptr_01 = '\0';
              uVar25 = 1;
              uVar19 = uVar29;
              do {
                iVar21 = -0x80;
                if (-0x80 < (int)uVar19) {
                  iVar21 = (int8_t)uVar19;
                }
                if (s2_beg != 0) {
                  iVar21 = '\0';
                }
                ptr_01[uVar25] = iVar21;
                auVar44 = _DAT_008d0a10;
                uVar25 = uVar25 + 1;
                uVar19 = uVar19 - gap;
              } while (s2Len + 1 != uVar25);
              uVar25 = 1;
              if (1 < s2Len) {
                uVar25 = (ulong)(uint)s2Len;
              }
              lVar15 = (ulong)(uVar16 + (uVar16 == 0)) << 4;
              uVar28 = 0;
              auVar45 = auVar36;
              auVar50 = auVar36;
              iVar22 = iVar12;
              do {
                ptr_02 = ptr;
                ptr = palVar10;
                uVar27 = ptr[uVar16 - 1][0];
                auVar55._0_8_ = uVar27 << 8;
                auVar55._8_8_ = ptr[uVar16 - 1][1] << 8 | uVar27 >> 0x38;
                iVar13 = ppVar4->mapper[(byte)s2[uVar28]];
                auVar55 = ~auVar44 & ZEXT116((byte)ptr_01[uVar28]) | auVar55;
                lVar20 = 0;
                auVar53 = auVar36;
                do {
                  auVar56 = paddsb(auVar55,*(undefined1 (*) [16])
                                            ((long)pvVar3 + lVar20 + uVar17 * (long)iVar13 * 0x10));
                  auVar55 = *(undefined1 (*) [16])((long)*ptr_00 + lVar20);
                  auVar64[0] = -(auVar55[0] < auVar56[0]);
                  auVar64[1] = -(auVar55[1] < auVar56[1]);
                  auVar64[2] = -(auVar55[2] < auVar56[2]);
                  auVar64[3] = -(auVar55[3] < auVar56[3]);
                  auVar64[4] = -(auVar55[4] < auVar56[4]);
                  auVar64[5] = -(auVar55[5] < auVar56[5]);
                  auVar64[6] = -(auVar55[6] < auVar56[6]);
                  auVar64[7] = -(auVar55[7] < auVar56[7]);
                  auVar64[8] = -(auVar55[8] < auVar56[8]);
                  auVar64[9] = -(auVar55[9] < auVar56[9]);
                  auVar64[10] = -(auVar55[10] < auVar56[10]);
                  auVar64[0xb] = -(auVar55[0xb] < auVar56[0xb]);
                  auVar64[0xc] = -(auVar55[0xc] < auVar56[0xc]);
                  auVar64[0xd] = -(auVar55[0xd] < auVar56[0xd]);
                  auVar64[0xe] = -(auVar55[0xe] < auVar56[0xe]);
                  auVar64[0xf] = -(auVar55[0xf] < auVar56[0xf]);
                  auVar56 = ~auVar64 & auVar55 | auVar56 & auVar64;
                  auVar57[0] = -(auVar53[0] < auVar56[0]);
                  auVar57[1] = -(auVar53[1] < auVar56[1]);
                  auVar57[2] = -(auVar53[2] < auVar56[2]);
                  auVar57[3] = -(auVar53[3] < auVar56[3]);
                  auVar57[4] = -(auVar53[4] < auVar56[4]);
                  auVar57[5] = -(auVar53[5] < auVar56[5]);
                  auVar57[6] = -(auVar53[6] < auVar56[6]);
                  auVar57[7] = -(auVar53[7] < auVar56[7]);
                  auVar57[8] = -(auVar53[8] < auVar56[8]);
                  auVar57[9] = -(auVar53[9] < auVar56[9]);
                  auVar57[10] = -(auVar53[10] < auVar56[10]);
                  auVar57[0xb] = -(auVar53[0xb] < auVar56[0xb]);
                  auVar57[0xc] = -(auVar53[0xc] < auVar56[0xc]);
                  auVar57[0xd] = -(auVar53[0xd] < auVar56[0xd]);
                  auVar57[0xe] = -(auVar53[0xe] < auVar56[0xe]);
                  auVar57[0xf] = -(auVar53[0xf] < auVar56[0xf]);
                  auVar56 = ~auVar57 & auVar53 | auVar56 & auVar57;
                  *(undefined1 (*) [16])((long)*ptr_02 + lVar20) = auVar56;
                  auVar58[0] = -(auVar56[0] < auVar45[0]);
                  auVar58[1] = -(auVar56[1] < auVar45[1]);
                  auVar58[2] = -(auVar56[2] < auVar45[2]);
                  auVar58[3] = -(auVar56[3] < auVar45[3]);
                  auVar58[4] = -(auVar56[4] < auVar45[4]);
                  auVar58[5] = -(auVar56[5] < auVar45[5]);
                  auVar58[6] = -(auVar56[6] < auVar45[6]);
                  auVar58[7] = -(auVar56[7] < auVar45[7]);
                  auVar58[8] = -(auVar56[8] < auVar45[8]);
                  auVar58[9] = -(auVar56[9] < auVar45[9]);
                  auVar58[10] = -(auVar56[10] < auVar45[10]);
                  auVar58[0xb] = -(auVar56[0xb] < auVar45[0xb]);
                  auVar58[0xc] = -(auVar56[0xc] < auVar45[0xc]);
                  auVar58[0xd] = -(auVar56[0xd] < auVar45[0xd]);
                  auVar58[0xe] = -(auVar56[0xe] < auVar45[0xe]);
                  auVar58[0xf] = -(auVar56[0xf] < auVar45[0xf]);
                  auVar45 = ~auVar58 & auVar56 | auVar45 & auVar58;
                  auVar65[0] = -(auVar56[0] < auVar66[0]);
                  auVar65[1] = -(auVar56[1] < auVar66[1]);
                  auVar65[2] = -(auVar56[2] < auVar66[2]);
                  auVar65[3] = -(auVar56[3] < auVar66[3]);
                  auVar65[4] = -(auVar56[4] < auVar66[4]);
                  auVar65[5] = -(auVar56[5] < auVar66[5]);
                  auVar65[6] = -(auVar56[6] < auVar66[6]);
                  auVar65[7] = -(auVar56[7] < auVar66[7]);
                  auVar65[8] = -(auVar56[8] < auVar66[8]);
                  auVar65[9] = -(auVar56[9] < auVar66[9]);
                  auVar65[10] = -(auVar56[10] < auVar66[10]);
                  auVar65[0xb] = -(auVar56[0xb] < auVar66[0xb]);
                  auVar65[0xc] = -(auVar56[0xc] < auVar66[0xc]);
                  auVar65[0xd] = -(auVar56[0xd] < auVar66[0xd]);
                  auVar65[0xe] = -(auVar56[0xe] < auVar66[0xe]);
                  auVar65[0xf] = -(auVar56[0xf] < auVar66[0xf]);
                  auVar66 = ~auVar65 & auVar66 | auVar56 & auVar65;
                  auVar68[0] = -(auVar55[0] < auVar66[0]);
                  auVar68[1] = -(auVar55[1] < auVar66[1]);
                  auVar68[2] = -(auVar55[2] < auVar66[2]);
                  auVar68[3] = -(auVar55[3] < auVar66[3]);
                  auVar68[4] = -(auVar55[4] < auVar66[4]);
                  auVar68[5] = -(auVar55[5] < auVar66[5]);
                  auVar68[6] = -(auVar55[6] < auVar66[6]);
                  auVar68[7] = -(auVar55[7] < auVar66[7]);
                  auVar68[8] = -(auVar55[8] < auVar66[8]);
                  auVar68[9] = -(auVar55[9] < auVar66[9]);
                  auVar68[10] = -(auVar55[10] < auVar66[10]);
                  auVar68[0xb] = -(auVar55[0xb] < auVar66[0xb]);
                  auVar68[0xc] = -(auVar55[0xc] < auVar66[0xc]);
                  auVar68[0xd] = -(auVar55[0xd] < auVar66[0xd]);
                  auVar68[0xe] = -(auVar55[0xe] < auVar66[0xe]);
                  auVar68[0xf] = -(auVar55[0xf] < auVar66[0xf]);
                  auVar66 = ~auVar68 & auVar66 | auVar55 & auVar68;
                  auVar48[0] = -(auVar53[0] < auVar66[0]);
                  auVar48[1] = -(auVar53[1] < auVar66[1]);
                  auVar48[2] = -(auVar53[2] < auVar66[2]);
                  auVar48[3] = -(auVar53[3] < auVar66[3]);
                  auVar48[4] = -(auVar53[4] < auVar66[4]);
                  auVar48[5] = -(auVar53[5] < auVar66[5]);
                  auVar48[6] = -(auVar53[6] < auVar66[6]);
                  auVar48[7] = -(auVar53[7] < auVar66[7]);
                  auVar48[8] = -(auVar53[8] < auVar66[8]);
                  auVar48[9] = -(auVar53[9] < auVar66[9]);
                  auVar48[10] = -(auVar53[10] < auVar66[10]);
                  auVar48[0xb] = -(auVar53[0xb] < auVar66[0xb]);
                  auVar48[0xc] = -(auVar53[0xc] < auVar66[0xc]);
                  auVar48[0xd] = -(auVar53[0xd] < auVar66[0xd]);
                  auVar48[0xe] = -(auVar53[0xe] < auVar66[0xe]);
                  auVar48[0xf] = -(auVar53[0xf] < auVar66[0xf]);
                  auVar66 = ~auVar48 & auVar66 | auVar53 & auVar48;
                  auVar58 = psubsb(auVar56,auVar49);
                  auVar56._4_4_ = uVar34;
                  auVar56._0_4_ = uVar34;
                  auVar56._8_4_ = uVar34;
                  auVar56._12_4_ = uVar34;
                  auVar55 = psubsb(auVar55,auVar56);
                  auVar67[0] = -(auVar58[0] < auVar55[0]);
                  auVar67[1] = -(auVar58[1] < auVar55[1]);
                  auVar67[2] = -(auVar58[2] < auVar55[2]);
                  auVar67[3] = -(auVar58[3] < auVar55[3]);
                  auVar67[4] = -(auVar58[4] < auVar55[4]);
                  auVar67[5] = -(auVar58[5] < auVar55[5]);
                  auVar67[6] = -(auVar58[6] < auVar55[6]);
                  auVar67[7] = -(auVar58[7] < auVar55[7]);
                  auVar67[8] = -(auVar58[8] < auVar55[8]);
                  auVar67[9] = -(auVar58[9] < auVar55[9]);
                  auVar67[10] = -(auVar58[10] < auVar55[10]);
                  auVar67[0xb] = -(auVar58[0xb] < auVar55[0xb]);
                  auVar67[0xc] = -(auVar58[0xc] < auVar55[0xc]);
                  auVar67[0xd] = -(auVar58[0xd] < auVar55[0xd]);
                  auVar67[0xe] = -(auVar58[0xe] < auVar55[0xe]);
                  auVar67[0xf] = -(auVar58[0xf] < auVar55[0xf]);
                  *(undefined1 (*) [16])((long)*ptr_00 + lVar20) =
                       ~auVar67 & auVar58 | auVar55 & auVar67;
                  auVar5._4_4_ = uVar34;
                  auVar5._0_4_ = uVar34;
                  auVar5._8_4_ = uVar34;
                  auVar5._12_4_ = uVar34;
                  auVar55 = psubsb(auVar53,auVar5);
                  auVar53[0] = -(auVar58[0] < auVar55[0]);
                  auVar53[1] = -(auVar58[1] < auVar55[1]);
                  auVar53[2] = -(auVar58[2] < auVar55[2]);
                  auVar53[3] = -(auVar58[3] < auVar55[3]);
                  auVar53[4] = -(auVar58[4] < auVar55[4]);
                  auVar53[5] = -(auVar58[5] < auVar55[5]);
                  auVar53[6] = -(auVar58[6] < auVar55[6]);
                  auVar53[7] = -(auVar58[7] < auVar55[7]);
                  auVar53[8] = -(auVar58[8] < auVar55[8]);
                  auVar53[9] = -(auVar58[9] < auVar55[9]);
                  auVar53[10] = -(auVar58[10] < auVar55[10]);
                  auVar53[0xb] = -(auVar58[0xb] < auVar55[0xb]);
                  auVar53[0xc] = -(auVar58[0xc] < auVar55[0xc]);
                  auVar53[0xd] = -(auVar58[0xd] < auVar55[0xd]);
                  auVar53[0xe] = -(auVar58[0xe] < auVar55[0xe]);
                  auVar53[0xf] = -(auVar58[0xf] < auVar55[0xf]);
                  auVar53 = ~auVar53 & auVar58 | auVar55 & auVar53;
                  auVar55 = *(undefined1 (*) [16])((long)*ptr + lVar20);
                  lVar20 = lVar20 + 0x10;
                } while (lVar15 != lVar20);
                uVar19 = 0;
                do {
                  uVar14 = uVar29;
                  if (s2_beg == 0) {
                    uVar14 = ptr_01[uVar28 + 1] - open;
                  }
                  if ((int)uVar14 < -0x7f) {
                    uVar14 = 0xffffff80;
                  }
                  auVar54._0_8_ = auVar53._0_8_ << 8;
                  auVar54._8_8_ = auVar53._8_8_ << 8 | auVar53._0_8_ >> 0x38;
                  auVar53 = auVar54 | ~auVar44 & ZEXT416(uVar14);
                  bVar32 = true;
                  uVar27 = 1;
                  lVar20 = 0;
                  do {
                    auVar55 = *(undefined1 (*) [16])((long)*ptr_02 + lVar20);
                    auVar62[0] = -(auVar53[0] < auVar55[0]);
                    auVar62[1] = -(auVar53[1] < auVar55[1]);
                    auVar62[2] = -(auVar53[2] < auVar55[2]);
                    auVar62[3] = -(auVar53[3] < auVar55[3]);
                    auVar62[4] = -(auVar53[4] < auVar55[4]);
                    auVar62[5] = -(auVar53[5] < auVar55[5]);
                    auVar62[6] = -(auVar53[6] < auVar55[6]);
                    auVar62[7] = -(auVar53[7] < auVar55[7]);
                    auVar62[8] = -(auVar53[8] < auVar55[8]);
                    auVar62[9] = -(auVar53[9] < auVar55[9]);
                    auVar62[10] = -(auVar53[10] < auVar55[10]);
                    auVar62[0xb] = -(auVar53[0xb] < auVar55[0xb]);
                    auVar62[0xc] = -(auVar53[0xc] < auVar55[0xc]);
                    auVar62[0xd] = -(auVar53[0xd] < auVar55[0xd]);
                    auVar62[0xe] = -(auVar53[0xe] < auVar55[0xe]);
                    auVar62[0xf] = -(auVar53[0xf] < auVar55[0xf]);
                    auVar55 = ~auVar62 & auVar53 | auVar55 & auVar62;
                    *(undefined1 (*) [16])((long)*ptr_02 + lVar20) = auVar55;
                    auVar59[0] = -(auVar55[0] < auVar66[0]);
                    auVar59[1] = -(auVar55[1] < auVar66[1]);
                    auVar59[2] = -(auVar55[2] < auVar66[2]);
                    auVar59[3] = -(auVar55[3] < auVar66[3]);
                    auVar59[4] = -(auVar55[4] < auVar66[4]);
                    auVar59[5] = -(auVar55[5] < auVar66[5]);
                    auVar59[6] = -(auVar55[6] < auVar66[6]);
                    auVar59[7] = -(auVar55[7] < auVar66[7]);
                    auVar59[8] = -(auVar55[8] < auVar66[8]);
                    auVar59[9] = -(auVar55[9] < auVar66[9]);
                    auVar59[10] = -(auVar55[10] < auVar66[10]);
                    auVar59[0xb] = -(auVar55[0xb] < auVar66[0xb]);
                    auVar59[0xc] = -(auVar55[0xc] < auVar66[0xc]);
                    auVar59[0xd] = -(auVar55[0xd] < auVar66[0xd]);
                    auVar59[0xe] = -(auVar55[0xe] < auVar66[0xe]);
                    auVar59[0xf] = -(auVar55[0xf] < auVar66[0xf]);
                    auVar66 = ~auVar59 & auVar66 | auVar55 & auVar59;
                    auVar46[0] = -(auVar55[0] < auVar45[0]);
                    auVar46[1] = -(auVar55[1] < auVar45[1]);
                    auVar46[2] = -(auVar55[2] < auVar45[2]);
                    auVar46[3] = -(auVar55[3] < auVar45[3]);
                    auVar46[4] = -(auVar55[4] < auVar45[4]);
                    auVar46[5] = -(auVar55[5] < auVar45[5]);
                    auVar46[6] = -(auVar55[6] < auVar45[6]);
                    auVar46[7] = -(auVar55[7] < auVar45[7]);
                    auVar46[8] = -(auVar55[8] < auVar45[8]);
                    auVar46[9] = -(auVar55[9] < auVar45[9]);
                    auVar46[10] = -(auVar55[10] < auVar45[10]);
                    auVar46[0xb] = -(auVar55[0xb] < auVar45[0xb]);
                    auVar46[0xc] = -(auVar55[0xc] < auVar45[0xc]);
                    auVar46[0xd] = -(auVar55[0xd] < auVar45[0xd]);
                    auVar46[0xe] = -(auVar55[0xe] < auVar45[0xe]);
                    auVar46[0xf] = -(auVar55[0xf] < auVar45[0xf]);
                    auVar45 = ~auVar46 & auVar55 | auVar45 & auVar46;
                    auVar55 = psubsb(auVar55,auVar49);
                    auVar6._4_4_ = uVar34;
                    auVar6._0_4_ = uVar34;
                    auVar6._8_4_ = uVar34;
                    auVar6._12_4_ = uVar34;
                    auVar53 = psubsb(auVar53,auVar6);
                    auVar60[0] = -(auVar55[0] < auVar53[0]);
                    auVar60[1] = -(auVar55[1] < auVar53[1]);
                    auVar60[2] = -(auVar55[2] < auVar53[2]);
                    auVar60[3] = -(auVar55[3] < auVar53[3]);
                    auVar60[4] = -(auVar55[4] < auVar53[4]);
                    auVar60[5] = -(auVar55[5] < auVar53[5]);
                    auVar60[6] = -(auVar55[6] < auVar53[6]);
                    auVar60[7] = -(auVar55[7] < auVar53[7]);
                    auVar60[8] = -(auVar55[8] < auVar53[8]);
                    auVar60[9] = -(auVar55[9] < auVar53[9]);
                    auVar60[10] = -(auVar55[10] < auVar53[10]);
                    auVar60[0xb] = -(auVar55[0xb] < auVar53[0xb]);
                    auVar60[0xc] = -(auVar55[0xc] < auVar53[0xc]);
                    auVar60[0xd] = -(auVar55[0xd] < auVar53[0xd]);
                    auVar60[0xe] = -(auVar55[0xe] < auVar53[0xe]);
                    auVar60[0xf] = -(auVar55[0xf] < auVar53[0xf]);
                    if ((((((((((((((((auVar60 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar60 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar60 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar60 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar60 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar60 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar60 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar60 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar60 >> 0x47 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar60 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar60 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar60 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar60 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar60 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar60 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar60[0xf]) break;
                    bVar32 = uVar27 < uVar17;
                    lVar20 = lVar20 + 0x10;
                    uVar27 = uVar27 + 1;
                  } while (lVar15 != lVar20);
                } while ((!bVar32) && (bVar32 = uVar19 < 0xf, uVar19 = uVar19 + 1, bVar32));
                alVar1 = ptr_02[(uint)(iVar7 % (int)uVar16)];
                auVar61[0] = -(auVar50[0] < (char)alVar1[0]);
                auVar61[1] = -(auVar50[1] < alVar1[0]._1_1_);
                auVar61[2] = -(auVar50[2] < alVar1[0]._2_1_);
                auVar61[3] = -(auVar50[3] < alVar1[0]._3_1_);
                auVar61[4] = -(auVar50[4] < alVar1[0]._4_1_);
                auVar61[5] = -(auVar50[5] < alVar1[0]._5_1_);
                auVar61[6] = -(auVar50[6] < alVar1[0]._6_1_);
                auVar61[7] = -(auVar50[7] < alVar1[0]._7_1_);
                auVar61[8] = -(auVar50[8] < (char)alVar1[1]);
                auVar61[9] = -(auVar50[9] < alVar1[1]._1_1_);
                auVar61[10] = -(auVar50[10] < alVar1[1]._2_1_);
                auVar61[0xb] = -(auVar50[0xb] < alVar1[1]._3_1_);
                auVar61[0xc] = -(auVar50[0xc] < alVar1[1]._4_1_);
                auVar61[0xd] = -(auVar50[0xd] < alVar1[1]._5_1_);
                auVar61[0xe] = -(auVar50[0xe] < alVar1[1]._6_1_);
                auVar61[0xf] = -(auVar50[0xf] < alVar1[1]._7_1_);
                auVar63[1] = -(cVar33 == '\x0e');
                auVar63[0] = -(cVar30 == '\x0f');
                auVar63[2] = -(cVar38 == '\r');
                auVar63[3] = -(cVar40 == '\f');
                auVar63[4] = -(cVar30 == '\v');
                auVar63[5] = -(cVar33 == '\n');
                auVar63[6] = -(cVar38 == '\t');
                auVar63[7] = -(cVar40 == '\b');
                auVar63[8] = -(cVar30 == '\a');
                auVar63[9] = -(cVar33 == '\x06');
                auVar63[10] = -(cVar38 == '\x05');
                auVar63[0xb] = -(cVar40 == '\x04');
                auVar63[0xc] = -(cVar30 == '\x03');
                auVar63[0xd] = -(cVar33 == '\x02');
                auVar63[0xe] = -(cVar38 == '\x01');
                auVar63[0xf] = -(cVar40 == '\0');
                auVar63 = auVar61 & auVar63;
                if ((((((((((((((((auVar63 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                                 (auVar63 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                                || (auVar63 >> 0x17 & (undefined1  [16])0x1) !=
                                   (undefined1  [16])0x0) ||
                               (auVar63 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || (auVar63 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                             || (auVar63 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                            || (auVar63 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                           || (auVar63 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar63 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar63 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar63 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar63 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar63 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar63 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar63 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar63[0xf] < '\0') {
                  iVar22 = (int)uVar28;
                }
                auVar50 = ~auVar61 & auVar50 | (undefined1  [16])alVar1 & auVar61;
                uVar52 = auVar50._14_2_;
                uVar28 = uVar28 + 1;
                palVar10 = ptr_02;
                if (uVar28 == uVar25) {
                  if (s2_end != 0) {
                    if (iVar8 < 0xf) {
                      iVar13 = 1;
                      if (1 < iVar18) {
                        iVar13 = iVar18;
                      }
                      do {
                        auVar51._0_8_ = auVar50._0_8_ << 8;
                        auVar51._8_8_ = auVar50._8_8_ << 8 | auVar50._0_8_ >> 0x38;
                        uVar52 = auVar50._13_2_;
                        iVar13 = iVar13 + -1;
                        auVar50 = auVar51;
                      } while (iVar13 != 0);
                    }
                    uVar24 = uVar52 >> 8;
                  }
                  cVar30 = (char)uVar24;
                  iVar13 = iVar7;
                  if ((s1_end != 0) && (((ulong)uVar2 + 0xf & 0x7ffffff0) != 0)) {
                    uVar17 = 0;
                    do {
                      iVar23 = ((uint)uVar17 & 0xf) * uVar16 + ((uint)(uVar17 >> 4) & 0xfffffff);
                      if (iVar23 < (int)uVar2) {
                        bVar11 = *(byte *)((long)*ptr_02 + uVar17);
                        if ((char)(byte)uVar24 < (char)bVar11) {
                          uVar24 = (ushort)bVar11;
                          iVar22 = iVar12;
                          iVar13 = iVar23;
                        }
                        else {
                          if (iVar13 <= iVar23) {
                            iVar23 = iVar13;
                          }
                          if (iVar22 != iVar12) {
                            iVar23 = iVar13;
                          }
                          if (bVar11 == (byte)uVar24) {
                            iVar13 = iVar23;
                          }
                        }
                      }
                      cVar30 = (char)uVar24;
                      uVar17 = uVar17 + 1;
                    } while ((uVar16 & 0x7ffffff) << 4 != (int)uVar17);
                  }
                  if (s2_end == 0 && s1_end == 0) {
                    uVar17 = ptr_02[(uint)(iVar7 % (int)uVar16)][0];
                    uVar25 = ptr_02[(uint)(iVar7 % (int)uVar16)][1];
                    if (iVar8 < 0xf) {
                      iVar8 = 1;
                      if (1 < iVar18) {
                        iVar8 = iVar18;
                      }
                      do {
                        uVar25 = uVar25 << 8 | uVar17 >> 0x38;
                        iVar8 = iVar8 + -1;
                        uVar17 = uVar17 << 8;
                      } while (iVar8 != 0);
                    }
                    cVar30 = (char)(uVar25 >> 0x38);
                    iVar22 = iVar12;
                    iVar13 = iVar7;
                  }
                  cVar33 = auVar35[0];
                  auVar50[0] = -(auVar66[0] < cVar33);
                  cVar38 = auVar35[1];
                  auVar50[1] = -(auVar66[1] < cVar38);
                  cVar40 = auVar35[2];
                  auVar50[2] = -(auVar66[2] < cVar40);
                  cVar42 = auVar35[3];
                  auVar50[3] = -(auVar66[3] < cVar42);
                  auVar50[4] = -(auVar66[4] < cVar33);
                  auVar50[5] = -(auVar66[5] < cVar38);
                  auVar50[6] = -(auVar66[6] < cVar40);
                  auVar50[7] = -(auVar66[7] < cVar42);
                  auVar50[8] = -(auVar66[8] < cVar33);
                  auVar50[9] = -(auVar66[9] < cVar38);
                  auVar50[10] = -(auVar66[10] < cVar40);
                  auVar50[0xb] = -(auVar66[0xb] < cVar42);
                  auVar50[0xc] = -(auVar66[0xc] < cVar33);
                  auVar50[0xd] = -(auVar66[0xd] < cVar38);
                  auVar50[0xe] = -(auVar66[0xe] < cVar40);
                  auVar50[0xf] = -(auVar66[0xf] < cVar42);
                  cVar33 = auVar43[0];
                  auVar47[0] = -(cVar33 < auVar45[0]);
                  cVar38 = auVar43[1];
                  auVar47[1] = -(cVar38 < auVar45[1]);
                  cVar40 = auVar43[2];
                  auVar47[2] = -(cVar40 < auVar45[2]);
                  cVar42 = auVar43[3];
                  auVar47[3] = -(cVar42 < auVar45[3]);
                  auVar47[4] = -(cVar33 < auVar45[4]);
                  auVar47[5] = -(cVar38 < auVar45[5]);
                  auVar47[6] = -(cVar40 < auVar45[6]);
                  auVar47[7] = -(cVar42 < auVar45[7]);
                  auVar47[8] = -(cVar33 < auVar45[8]);
                  auVar47[9] = -(cVar38 < auVar45[9]);
                  auVar47[10] = -(cVar40 < auVar45[10]);
                  auVar47[0xb] = -(cVar42 < auVar45[0xb]);
                  auVar47[0xc] = -(cVar33 < auVar45[0xc]);
                  auVar47[0xd] = -(cVar38 < auVar45[0xd]);
                  auVar47[0xe] = -(cVar40 < auVar45[0xe]);
                  auVar47[0xf] = -(cVar42 < auVar45[0xf]);
                  auVar47 = auVar47 | auVar50;
                  if ((((((((((((((((auVar47 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar47 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar47 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar47 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar47 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar47 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar47 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar47 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar47 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar47 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar47 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar47 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar47 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar47 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar47 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar47[0xf] < '\0') {
                    *(byte *)&ppVar9->flag = (byte)ppVar9->flag | 0x40;
                    cVar30 = '\0';
                    iVar22 = 0;
                    iVar13 = 0;
                  }
                  ppVar9->score = (int)cVar30;
                  ppVar9->end_query = iVar13;
                  ppVar9->end_ref = iVar22;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(ptr);
                  parasail_free(ptr_02);
                  return ppVar9;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int8_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    int8_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile8.score;
    vGapO = _mm_set1_epi8(open);
    vGapE = _mm_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi8(_mm_set1_epi8(position),
            _mm_set_epi8(0,1,2,3,4,5,6,7,8,9,10,11,12,13,14,15));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_16;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int8_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_8_t h;
            __m128i_8_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 1);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi8_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi8(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi8_rpl(vH, vE);
            vH = _mm_max_epi8_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi8_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_subs_epi8(vH, vGapO);
            vE = _mm_subs_epi8(vE, vGapE);
            vE = _mm_max_epi8_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi8(vF, vGapE);
            vF = _mm_max_epi8_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int8_t tmp2 = tmp < INT8_MIN ? INT8_MIN : tmp;
            vF = _mm_slli_si128(vF, 1);
            vF = _mm_insert_epi8_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi8_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi8_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_subs_epi8(vH, vGapO);
                vF = _mm_subs_epi8(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi8(vF, vH))) goto end;
                /*vF = _mm_max_epi8_rpl(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi8(vH, vMaxH));
            vMaxH = _mm_max_epi8_rpl(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm_extract_epi8_rpl (vH, 15);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 1);
        }
        score = (int8_t) _mm_extract_epi8_rpl(vMaxH, 15);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int8_t *t = (int8_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
            }
            score = (int8_t) _mm_extract_epi8_rpl (vH, 15);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi8(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}